

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

bool __thiscall glslang::TParseContext::isIoResizeArray(TParseContext *this,TType *type)

{
  int iVar1;
  EShLanguage EVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  
  iVar1 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar1 != '\0') {
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EVar2 == EShLangGeometry) {
      iVar1 = (*type->_vptr_TType[0xb])(type);
      if ((*(uint *)(CONCAT44(extraout_var,iVar1) + 8) & 0x7f) == 3) {
        return true;
      }
      EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    }
    if (((EVar2 == EShLangTessControl) &&
        (iVar1 = (*type->_vptr_TType[0xb])(type),
        (*(uint *)(CONCAT44(extraout_var_00,iVar1) + 8) & 0x7f) == 4)) &&
       (iVar1 = (*type->_vptr_TType[0xb])(type),
       (*(byte *)(CONCAT44(extraout_var_01,iVar1) + 0xd) & 0x10) == 0)) {
      return true;
    }
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EVar2 == EShLangFragment) {
      iVar1 = (*type->_vptr_TType[0xb])(type);
      if ((*(uint *)(CONCAT44(extraout_var_02,iVar1) + 8) & 0x7f) == 3) {
        iVar1 = (*type->_vptr_TType[0xb])(type);
        if ((*(byte *)(CONCAT44(extraout_var_03,iVar1) + 0xc) & 0x80) != 0) {
          return true;
        }
        iVar1 = (*type->_vptr_TType[0xb])(type);
        if ((*(byte *)(CONCAT44(extraout_var_04,iVar1) + 0xd) & 1) != 0) {
          return true;
        }
      }
      EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    }
    if ((EVar2 == EShLangMesh) &&
       (iVar1 = (*type->_vptr_TType[0xb])(type),
       (*(uint *)(CONCAT44(extraout_var_05,iVar1) + 8) & 0x7f) == 4)) {
      iVar1 = (*type->_vptr_TType[0xb])(type);
      return (*(byte *)(CONCAT44(extraout_var_06,iVar1) + 0xd) & 8) == 0;
    }
  }
  return false;
}

Assistant:

bool TParseContext::isIoResizeArray(const TType& type) const
{
    return type.isArray() &&
           ((language == EShLangGeometry    && type.getQualifier().storage == EvqVaryingIn) ||
            (language == EShLangTessControl && type.getQualifier().storage == EvqVaryingOut &&
                ! type.getQualifier().patch) ||
            (language == EShLangFragment && type.getQualifier().storage == EvqVaryingIn &&
                (type.getQualifier().pervertexNV || type.getQualifier().pervertexEXT)) ||
            (language == EShLangMesh && type.getQualifier().storage == EvqVaryingOut &&
                !type.getQualifier().perTaskNV));
}